

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_loongson_integer(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  uint uVar1;
  long lVar2;
  _Bool temp_local;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGLabel *pTVar3;
  TCGLabel *pTVar4;
  TCGLabel *a1_01;
  TCGv_i64 pTVar5;
  TCGv_i64 a2;
  uintptr_t o_4;
  TCGOpcode TVar6;
  TCGContext_conflict6 *tcg_ctx;
  ulong uVar7;
  uintptr_t o_5;
  TCGv_i64 arg1;
  
  if (rd == 0) {
    return;
  }
  temp_local = false;
  uVar1 = opc + 0x8ffffff0;
  if ((3 < uVar1) && ((5 < opc + 0x83ffffe8 || ((0x33U >> (opc + 0x83ffffe8 & 0x1f) & 1) == 0)))) {
    temp_local = true;
  }
  a1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,temp_local);
  arg1 = (TCGv_i64)((long)a1 - (long)ctx);
  a1_00 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,temp_local);
  if (rs == 0) {
    TVar6 = INDEX_op_movi_i64;
    pTVar5 = (TCGv_i64)0x0;
LAB_009a470f:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar6,(TCGArg)a1,(TCGArg)pTVar5);
  }
  else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) != arg1) {
    pTVar5 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) + (long)ctx;
    TVar6 = INDEX_op_mov_i64;
    goto LAB_009a470f;
  }
  pTVar5 = (TCGv_i64)((long)a1_00 - (long)ctx);
  if (rt == 0) {
    TVar6 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_009a4751:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar6,(TCGArg)a1_00,(TCGArg)a2);
  }
  else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2) != pTVar5) {
    a2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2) + (long)ctx;
    TVar6 = INDEX_op_mov_i64;
    goto LAB_009a4751;
  }
  if (uVar1 < 0x10) {
    (*(code *)(&DAT_00da0010 + *(int *)(&DAT_00da0010 + (ulong)uVar1 * 4)))();
    return;
  }
  switch(opc) {
  case 0x7c000018:
    lVar2 = *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2);
    goto LAB_009a4cd8;
  case 0x7c000019:
    tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar5,pTVar5);
    lVar2 = *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2);
LAB_009a4cd8:
    tcg_gen_op3_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_mul_i64,(long)&(ctx->base).tb + lVar2,(TCGArg)a1
               ,(TCGArg)a1_00);
    tcg_gen_ext32s_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),
               *(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2));
    goto switchD_009a479b_caseD_7c000020;
  case 0x7c00001a:
    pTVar4 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    pTVar3 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    a1_01 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    tcg_gen_ext32s_i64_mips64el((TCGContext_conflict6 *)ctx,arg1,arg1);
    tcg_gen_ext32s_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar5,pTVar5);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,0,pTVar4);
    uVar7 = (ulong)(uint)rd;
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + uVar7 * 2),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar4 = *(byte *)pTVar4 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar4);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,arg1,-0x80000000,pTVar3);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,-1,pTVar3);
    if (*(TCGv_i64 *)(&ctx[0xf9].gi + uVar7 * 2) != arg1) {
      tcg_gen_op2_mips64el
                ((TCGContext_conflict6 *)ctx,INDEX_op_mov_i64,
                 (TCGArg)(*(TCGv_i64 *)(&ctx[0xf9].gi + uVar7 * 2) + (long)ctx),(TCGArg)a1);
    }
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_div_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + uVar7 * 2),arg1,pTVar5);
    tcg_gen_ext32s_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + uVar7 * 2),
               *(TCGv_i64 *)(&ctx[0xf9].gi + uVar7 * 2));
    *(byte *)a1_01 = *(byte *)a1_01 | 1;
    goto LAB_009a501d;
  case 0x7c00001b:
    pTVar4 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    a1_01 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar5,pTVar5);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,0,pTVar4);
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar4 = *(byte *)pTVar4 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar4);
    tcg_gen_divu_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),arg1,
               pTVar5);
    goto LAB_009a4f5c;
  case 0x7c00001c:
  case 0x7c00001d:
    tcg_gen_op3_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_mul_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),(TCGArg)a1,
               (TCGArg)a1_00);
    goto switchD_009a479b_caseD_7c000020;
  case 0x7c00001e:
    pTVar4 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    pTVar3 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    a1_01 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,0,pTVar4);
    uVar7 = (ulong)(uint)rd;
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + uVar7 * 2),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar4 = *(byte *)pTVar4 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar4);
    tcg_gen_brcondi_i64_mips64el
              ((TCGContext_conflict6 *)ctx,TCG_COND_NE,arg1,-0x8000000000000000,pTVar3);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,-1,pTVar3);
    if (*(TCGv_i64 *)(&ctx[0xf9].gi + uVar7 * 2) != arg1) {
      tcg_gen_op2_mips64el
                ((TCGContext_conflict6 *)ctx,INDEX_op_mov_i64,
                 (TCGArg)(*(TCGv_i64 *)(&ctx[0xf9].gi + uVar7 * 2) + (long)ctx),(TCGArg)a1);
    }
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_div_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + uVar7 * 2),arg1,pTVar5);
    break;
  case 0x7c00001f:
    pTVar4 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    a1_01 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,0,pTVar4);
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar4 = *(byte *)pTVar4 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar4);
    tcg_gen_divu_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),arg1,
               pTVar5);
    break;
  default:
    goto switchD_009a479b_caseD_7c000020;
  case 0x7c000022:
    pTVar4 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    pTVar3 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    a1_01 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar5,pTVar5);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_EQ,pTVar5,0,pTVar4);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,arg1,-0x80000000,pTVar3);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,-1,pTVar3);
    *(byte *)pTVar4 = *(byte *)pTVar4 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar4);
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_rem_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),arg1,
               pTVar5);
    goto LAB_009a4f5c;
  case 0x7c000023:
    pTVar4 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    a1_01 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar5,pTVar5);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,0,pTVar4);
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar4 = *(byte *)pTVar4 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar4);
    tcg_gen_remu_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),arg1,
               pTVar5);
LAB_009a4f5c:
    tcg_gen_ext32s_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),
               *(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2));
    break;
  case 0x7c000026:
    pTVar4 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    pTVar3 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    a1_01 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_EQ,pTVar5,0,pTVar4);
    tcg_gen_brcondi_i64_mips64el
              ((TCGContext_conflict6 *)ctx,TCG_COND_NE,arg1,-0x8000000000000000,pTVar3);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,-1,pTVar3);
    *(byte *)pTVar4 = *(byte *)pTVar4 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar4);
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar3 = *(byte *)pTVar3 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar3);
    tcg_gen_rem_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),arg1,
               pTVar5);
    break;
  case 0x7c000027:
    pTVar4 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    a1_01 = gen_new_label_mips64el((TCGContext_conflict6 *)ctx);
    tcg_gen_brcondi_i64_mips64el((TCGContext_conflict6 *)ctx,TCG_COND_NE,pTVar5,0,pTVar4);
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),0);
    *(short *)&a1_01->field_0x2 =
         (short)((uint)*(ushort *)&a1_01->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_br,(TCGArg)a1_01);
    *(byte *)pTVar4 = *(byte *)pTVar4 | 1;
    tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)pTVar4);
    tcg_gen_remu_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),arg1,
               pTVar5);
  }
  *(byte *)a1_01 = *(byte *)a1_01 | 1;
LAB_009a501d:
  tcg_gen_op1_mips64el((TCGContext_conflict6 *)ctx,INDEX_op_set_label,(TCGArg)a1_01);
switchD_009a479b_caseD_7c000020:
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(arg1 + (long)ctx));
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(pTVar5 + (long)ctx));
  return;
}

Assistant:

static void gen_loongson_integer(DisasContext *ctx, uint32_t opc,
                                 int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }

    switch (opc) {
    case OPC_MULT_G_2E:
    case OPC_MULT_G_2F:
    case OPC_MULTU_G_2E:
    case OPC_MULTU_G_2F:
#if defined(TARGET_MIPS64)
    case OPC_DMULT_G_2E:
    case OPC_DMULT_G_2F:
    case OPC_DMULTU_G_2E:
    case OPC_DMULTU_G_2F:
#endif
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        break;
    default:
        t0 = tcg_temp_local_new(tcg_ctx);
        t1 = tcg_temp_local_new(tcg_ctx);
        break;
    }

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case OPC_MULT_G_2E:
    case OPC_MULT_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_MULTU_G_2E:
    case OPC_MULTU_G_2F:
        tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
        tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_DIV_G_2E:
    case OPC_DIV_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, INT_MIN, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1, l2);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DIVU_G_2E:
    case OPC_DIVU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l2);
        }
        break;
    case OPC_MOD_G_2E:
    case OPC_MOD_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, INT_MIN, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_MODU_G_2E:
    case OPC_MODU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l2);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMULT_G_2E:
    case OPC_DMULT_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_DMULTU_G_2E:
    case OPC_DMULTU_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_DDIV_G_2E:
    case OPC_DDIV_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, -1LL << 63, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1LL, l2);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DDIVU_G_2E:
    case OPC_DDIVU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l2);
        }
        break;
    case OPC_DMOD_G_2E:
    case OPC_DMOD_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, -1LL << 63, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1LL, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DMODU_G_2E:
    case OPC_DMODU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l2);
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}